

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O1

void printfmt<int,std::__cxx11::string>
               (ostream *out,char *format,int *arg,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  char cVar1;
  size_t sVar2;
  char *__s;
  char local_2a;
  char local_29;
  
  __s = format + 4;
  do {
    cVar1 = __s[-4];
    if (cVar1 == '{') {
      if (__s[-3] == '}') {
        std::ostream::operator<<((ostream *)out,*arg);
        do {
          cVar1 = __s[-2];
          if (cVar1 == '{') {
            if (__s[-1] == '}') {
              std::__ostream_insert<char,std::char_traits<char>>
                        (out,(args->_M_dataplus)._M_p,args->_M_string_length);
              sVar2 = strlen(__s);
              std::__ostream_insert<char,std::char_traits<char>>(out,__s,sVar2);
              return;
            }
          }
          else if (cVar1 == '\0') {
            return;
          }
          local_2a = cVar1;
          std::__ostream_insert<char,std::char_traits<char>>(out,&local_2a,1);
          __s = __s + 1;
        } while( true );
      }
    }
    else if (cVar1 == '\0') {
      return;
    }
    local_29 = cVar1;
    std::__ostream_insert<char,std::char_traits<char>>(out,&local_29,1);
    __s = __s + 1;
  } while( true );
}

Assistant:

inline void printfmt(std::ostream& out, const char *format, const T& arg, const Args&... args) {
    char* s = const_cast<char*>(format);
    for (unsigned char ch; (ch = *s) != '\0'; out << *s++) {
        if (ch == '{' && *(s+1) == '}') {
            print(out, arg);
            printfmt(out, s+2, args...);
            break;
        }
    }
}